

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O0

bool fizplex::MPSReader::is_indicator(string *word)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  string *in_RDI;
  char *unaff_retaddr;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar2 = 0;
  while( true ) {
    if (3 < iVar2) {
      return false;
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    __x._M_len._7_1_ = in_stack_ffffffffffffffff;
    __x._M_len._0_7_ = in_stack_fffffffffffffff8;
    __x._M_str = unaff_retaddr;
    __y._M_len._4_4_ = iVar2;
    __y._M_len._0_4_ = in_stack_ffffffffffffffe8;
    __y._M_str = (char *)in_RDI;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    iVar2 = iVar2 + 1;
  }
  return true;
}

Assistant:

bool is_indicator(const std::string &word) {
  for (int i = 0; i < indicator_count; ++i) {
    if (word == indicators[i])
      return true;
  }
  return false;
}